

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Check(FT_Outline *outline)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  short sVar5;
  
  if (outline != (FT_Outline *)0x0) {
    sVar1 = outline->n_contours;
    sVar2 = outline->n_points;
    if (sVar2 == 0 && sVar1 == 0) {
      return 0;
    }
    if (0 < sVar1 && 0 < sVar2) {
      lVar4 = 0;
      sVar5 = -1;
      do {
        sVar3 = outline->contours[lVar4];
        if (sVar2 <= sVar3) {
          return 6;
        }
        if (sVar3 <= sVar5) {
          return 6;
        }
        lVar4 = lVar4 + 1;
        sVar5 = sVar3;
      } while (sVar1 != lVar4);
      if (sVar3 == (short)(sVar2 + -1)) {
        return 0;
      }
    }
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Check( FT_Outline*  outline )
  {
    if ( outline )
    {
      FT_Int  n_points   = outline->n_points;
      FT_Int  n_contours = outline->n_contours;
      FT_Int  end0, end;
      FT_Int  n;


      /* empty glyph? */
      if ( n_points == 0 && n_contours == 0 )
        return FT_Err_Ok;

      /* check point and contour counts */
      if ( n_points <= 0 || n_contours <= 0 )
        goto Bad;

      end0 = end = -1;
      for ( n = 0; n < n_contours; n++ )
      {
        end = outline->contours[n];

        /* note that we don't accept empty contours */
        if ( end <= end0 || end >= n_points )
          goto Bad;

        end0 = end;
      }

      if ( end != n_points - 1 )
        goto Bad;

      /* XXX: check the tags array */
      return FT_Err_Ok;
    }

  Bad:
    return FT_THROW( Invalid_Argument );
  }